

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

bool slang::syntax::SequenceExprSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x152) {
    if ((int)kind < 0x92) {
      if (((kind != AndSequenceExpr) && (kind != BinaryEventExpression)) &&
         (kind != ClockingSequenceExpr)) {
        return false;
      }
    }
    else if (((kind != DelayedSequenceExpr) && (kind != FirstMatchSequenceExpr)) &&
            (kind != IntersectSequenceExpr)) {
      return false;
    }
  }
  else if (((0x18 < kind - OrSequenceExpr) ||
           ((0x1100001U >> (kind - OrSequenceExpr & 0x1f) & 1) == 0)) &&
          (((0x24 < kind - SignalEventExpression ||
            ((0x1000000101U >> ((ulong)(kind - SignalEventExpression) & 0x3f) & 1) == 0)) &&
           (kind != WithinSequenceExpr)))) {
    return false;
  }
  return true;
}

Assistant:

bool SequenceExprSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AndSequenceExpr:
        case SyntaxKind::BinaryEventExpression:
        case SyntaxKind::ClockingSequenceExpr:
        case SyntaxKind::DelayedSequenceExpr:
        case SyntaxKind::FirstMatchSequenceExpr:
        case SyntaxKind::IntersectSequenceExpr:
        case SyntaxKind::OrSequenceExpr:
        case SyntaxKind::ParenthesizedEventExpression:
        case SyntaxKind::ParenthesizedSequenceExpr:
        case SyntaxKind::SignalEventExpression:
        case SyntaxKind::SimpleSequenceExpr:
        case SyntaxKind::ThroughoutSequenceExpr:
        case SyntaxKind::WithinSequenceExpr:
            return true;
        default:
            return false;
    }
}